

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int __thiscall
Solution::maximumsSplicedArray
          (Solution *this,vector<int,_std::allocator<int>_> *nums1,
          vector<int,_std::allocator<int>_> *nums2)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  allocator_type local_45;
  value_type_conflict local_44;
  vector<int,_std::allocator<int>_> diff;
  
  uVar12 = (ulong)((long)(nums1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(nums1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  iVar11 = (int)uVar12;
  local_44 = 0;
  std::vector<int,_std::allocator<int>_>::vector(&diff,(long)iVar11,&local_44,&local_45);
  piVar2 = (nums1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar3 = (nums2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar8 = 0;
  uVar12 = uVar12 & 0xffffffff;
  if (iVar11 < 1) {
    uVar12 = uVar8;
  }
  iVar4 = 0;
  iVar5 = 0;
  for (; uVar12 != uVar8; uVar8 = uVar8 + 1) {
    iVar6 = piVar2[uVar8];
    iVar5 = iVar5 + iVar6;
    iVar9 = piVar3[uVar8];
    iVar4 = iVar4 + iVar9;
    diff.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [uVar8] = iVar6 - iVar9;
  }
  iVar6 = iVar4;
  if (iVar4 < iVar5) {
    iVar6 = iVar5;
  }
  iVar9 = *diff.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar7 = 1;
  do {
    if (iVar11 <= lVar7) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&diff.super__Vector_base<int,_std::allocator<int>_>);
      return iVar6;
    }
    iVar1 = diff.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar7];
    if (iVar9 < 1) {
      if (iVar1 < 0) goto LAB_001017b5;
      iVar10 = iVar5 - iVar9;
      iVar9 = iVar1;
      if (iVar6 <= iVar10) {
        iVar6 = iVar10;
      }
    }
    else if (iVar1 < 1) {
      iVar10 = iVar9 + iVar4;
      iVar9 = iVar1;
      if (iVar6 <= iVar10) {
        iVar6 = iVar10;
      }
    }
    else {
LAB_001017b5:
      iVar9 = iVar1 + iVar9;
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

int maximumsSplicedArray(vector<int>& nums1, vector<int>& nums2) {
        int n = nums1.size();
        int sum1 = 0, sum2 = 0;


        vector<int> diff(n, 0);
        for (int i = 0; i < n; i++) {
            sum1 += nums1[i];
            sum2 += nums2[i];
            diff[i] = nums1[i] - nums2[i];
        }


        int res = max(sum1, sum2);
        int accu = diff[0];
        for (int i = 1; i < n; i++) {
            if (accu > 0) {
                if (diff[i] > 0) accu += diff[i];
                else {
                    res = max(res, sum2 + abs(accu));
                    accu = diff[i];
                }
            } else {
                if (diff[i] < 0) accu += diff[i];
                else {
                    res = max(res, sum1 + abs(accu));
                    accu = diff[i];
                }
            }
        }



        return res;
    }